

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_property_float(nk_context *ctx,char *name,float min,float *val,float max,float step,
                      float inc_per_pixel)

{
  float *in_RDX;
  long in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  nk_property_variant variant;
  nk_property_filter in_stack_00000090;
  float in_stack_00000094;
  nk_property_variant *in_stack_00000098;
  char *in_stack_000000a0;
  nk_context *in_stack_000000a8;
  nk_property_variant local_80;
  undefined1 local_58 [8];
  float local_50;
  float *local_20;
  
  if ((((in_RDI != 0) && (*(long *)(in_RDI + 0x3fc8) != 0)) && (in_RSI != 0)) &&
     (in_RDX != (float *)0x0)) {
    local_20 = in_RDX;
    nk_property_variant_float(&local_80,*in_RDX,in_XMM0_Da,in_XMM1_Da,in_XMM2_Da);
    memcpy(local_58,&local_80,0x28);
    nk_property(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000094,
                in_stack_00000090);
    *local_20 = local_50;
  }
  return;
}

Assistant:

NK_API void
nk_property_float(struct nk_context *ctx, const char *name,
    float min, float *val, float max, float step, float inc_per_pixel)
{
    struct nk_property_variant variant;
    NK_ASSERT(ctx);
    NK_ASSERT(name);
    NK_ASSERT(val);

    if (!ctx || !ctx->current || !name || !val) return;
    variant = nk_property_variant_float(*val, min, max, step);
    nk_property(ctx, name, &variant, inc_per_pixel, NK_FILTER_FLOAT);
    *val = variant.value.f;
}